

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O2

void __thiscall
LiteScript::Namer::Save(Namer *this,ostream *stream,Namer *namer,offset_in_Memory_to_subr caller)

{
  long lVar1;
  long lVar2;
  Object *pOVar3;
  Namer *pNVar4;
  ulong uVar5;
  long *plVar6;
  
  pOVar3 = Variable::operator->((Variable *)stream);
  plVar6 = (long *)((long)(pOVar3->memory->arr)._M_elems + caller);
  pNVar4 = namer;
  if (((ulong)namer & 1) != 0) {
    pNVar4 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
  }
  pOVar3 = Variable::operator->((Variable *)stream);
  (*(code *)pNVar4)(plVar6,this,pOVar3->ID);
  pOVar3 = Variable::operator->((Variable *)stream);
  plVar6 = (long *)((long)(pOVar3->memory->arr)._M_elems + caller);
  pNVar4 = namer;
  if (((ulong)namer & 1) != 0) {
    pNVar4 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
  }
  pOVar3 = Variable::operator->((Variable *)(stream + 0x10));
  (*(code *)pNVar4)(plVar6,this,pOVar3->ID);
  OStreamer::Write<unsigned_int>
            ((ostream *)this,
             (uint)((ulong)(*(long *)(stream + 0x38) - *(long *)(stream + 0x30)) >> 4));
  lVar1 = *(long *)(stream + 0x38);
  lVar2 = *(long *)(stream + 0x30);
  for (uVar5 = 0; (lVar1 - lVar2 & 0xffffffff0U) != uVar5; uVar5 = uVar5 + 0x10) {
    pOVar3 = Variable::operator->((Variable *)stream);
    plVar6 = (long *)((long)(pOVar3->memory->arr)._M_elems + caller);
    pNVar4 = namer;
    if (((ulong)namer & 1) != 0) {
      pNVar4 = *(Namer **)((namer->current).data + *plVar6 + -0x11);
    }
    pOVar3 = Variable::operator->((Variable *)(*(long *)(stream + 0x30) + uVar5));
    (*(code *)pNVar4)(plVar6,this,pOVar3->ID);
  }
  return;
}

Assistant:

void LiteScript::Namer::Save(std::ostream &stream, Namer &namer, bool (Memory::*caller)(std::ostream&, unsigned int)) {
    (namer.global->memory.*caller)(stream, namer.global->ID);
    (namer.global->memory.*caller)(stream, (*namer.current)->ID);
    OStreamer::Write<unsigned int>(stream, namer.heap.size());
    for (unsigned int i = 0, sz = namer.heap.size(); i < sz; i++)
        (namer.global->memory.*caller)(stream, namer.heap[i]->ID);
}